

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_fixed_suite::fixed_front_const(void)

{
  iterator begin;
  iterator end;
  iterator first;
  size_type length;
  const_reference piVar1;
  undefined4 local_38 [2];
  undefined1 local_30 [8];
  circular_view<int,_4UL> span;
  array<int,_4UL> array;
  
  span.member.next = 0x160000000b;
  begin = std::array<int,_4UL>::begin((array<int,_4UL> *)&span.member.next);
  end = std::array<int,_4UL>::end((array<int,_4UL> *)&span.member.next);
  first = std::array<int,_4UL>::begin((array<int,_4UL> *)&span.member.next);
  length = std::array<int,_4UL>::size((array<int,_4UL> *)&span.member.next);
  vista::circular_view<int,4ul>::circular_view<int*>
            ((circular_view<int,4ul> *)local_30,begin,end,first,length);
  piVar1 = vista::circular_view<int,_4UL>::front((circular_view<int,_4UL> *)local_30);
  local_38[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span.front()","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x368,"void api_fixed_suite::fixed_front_const()",piVar1,local_38);
  return;
}

Assistant:

void fixed_front_const()
{
    std::array<int, 4> array = {11, 22, 33, 44};
    const circular_view<int, 4> span(array.begin(), array.end(), array.begin(), array.size());
    BOOST_TEST_EQ(span.front(), 11);
}